

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppFVar4;
  FieldGenerator *pFVar5;
  OneofDescriptor *this_00;
  string *value;
  int local_2c;
  int i_1;
  FieldDescriptor *field;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,"void $classname$::SharedDtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  bVar1 = SupportsArenas(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,
                       "::google::protobuf::Arena* arena = GetArenaNoVirtual();\nif (arena != NULL) {\n  return;\n}\n\n"
                      );
  }
  for (field._4_4_ = 0;
      sVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), (ulong)(long)field._4_4_ < sVar3;
      field._4_4_ = field._4_4_ + 1) {
    ppFVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(long)field._4_4_);
    pFVar5 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar4);
    (*pFVar5->_vptr_FieldGenerator[0xf])(pFVar5,printer);
  }
  for (local_2c = 0; iVar2 = Descriptor::oneof_decl_count(this->descriptor_), local_2c < iVar2;
      local_2c = local_2c + 1) {
    this_00 = Descriptor::oneof_decl(this->descriptor_,local_2c);
    value = OneofDescriptor::name_abi_cxx11_(this_00);
    io::Printer::Print(printer,"if (has_$oneof_name$()) {\n  clear_$oneof_name$();\n}\n",
                       "oneof_name",value);
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_weak_field_map_.ClearAll();\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedDestructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedDtor() {\n",
    "classname", classname_);
  printer->Indent();
  if (SupportsArenas(descriptor_)) {
    // Do nothing when the message is allocated in an arena.
    printer->Print(
      "::google::protobuf::Arena* arena = GetArenaNoVirtual();\n"
      "if (arena != NULL) {\n"
      "  return;\n"
      "}\n"
      "\n");
  }

  // Write the destructors for each field except oneof members.
  // optimized_order_ does not contain oneof fields.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    field_generators_.get(field).GenerateDestructorCode(printer);
  }

  // Generate code to destruct oneofs. Clearing should do the work.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "if (has_$oneof_name$()) {\n"
        "  clear_$oneof_name$();\n"
        "}\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.ClearAll();\n");
  }
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");
}